

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O0

void setcharorrange(uchar **pp,uchar *charset)

{
  byte *pbVar1;
  char_class cVar2;
  char_class cVar3;
  byte c_00;
  byte local_29;
  uchar endrange;
  char_class cc;
  uchar c;
  uchar *p;
  uchar *charset_local;
  uchar **pp_local;
  
  pbVar1 = *pp;
  *pp = pbVar1 + 1;
  endrange = *pbVar1;
  charset[endrange] = '\x01';
  if (((((0x2f < endrange) && (endrange < 0x3a)) || ((0x60 < endrange && (endrange < 0x7b)))) ||
      ((0x40 < endrange && (endrange < 0x5b)))) && (pbVar1[1] == 0x2d)) {
    cVar2 = charclass(endrange);
    local_29 = pbVar1[2];
    _cc = pbVar1 + 3;
    if (local_29 == 0x5c) {
      _cc = pbVar1 + 4;
      local_29 = pbVar1[3];
    }
    if ((endrange <= local_29) && (cVar3 = charclass(local_29), cVar3 == cVar2)) {
      while (c_00 = endrange + 1, endrange != local_29) {
        cVar3 = charclass(c_00);
        endrange = c_00;
        if (cVar3 == cVar2) {
          charset[c_00] = '\x01';
        }
      }
      *pp = _cc;
    }
  }
  return;
}

Assistant:

static void setcharorrange(unsigned char **pp, unsigned char *charset)
{
  unsigned char *p = (*pp)++;
  unsigned char c = *p++;

  charset[c] = 1;
  if(ISALNUM(c) && *p++ == '-') {
    char_class cc = charclass(c);
    unsigned char endrange = *p++;

    if(endrange == '\\')
      endrange = *p++;
    if(endrange >= c && charclass(endrange) == cc) {
      while(c++ != endrange)
        if(charclass(c) == cc)  /* Chars in class may be not consecutive. */
          charset[c] = 1;
      *pp = p;
    }
  }
}